

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O2

void OPN2_GenerateStream(ym3438_t *chip,Bit16s *output,Bit32u numsamples)

{
  long lVar1;
  Bit16s buffer [2];
  undefined4 local_2c;
  
  for (lVar1 = 0; numsamples != (Bit32u)lVar1; lVar1 = lVar1 + 1) {
    OPN2_GenerateResampled(chip,(Bit16s *)&local_2c);
    *(undefined4 *)(output + lVar1 * 2) = local_2c;
  }
  return;
}

Assistant:

void OPN2_GenerateStream(ym3438_t *chip, Bit16s *output, Bit32u numsamples)
{
    Bit32u i;
    Bit16s buffer[2];

    for (i = 0; i < numsamples; i++)
    {
        OPN2_GenerateResampled(chip, buffer);
        *output++ = buffer[0];
        *output++ = buffer[1];
    }
}